

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quadtree.c
# Opt level: O1

void SplitTree(QuadTreeNode *Tree)

{
  Triangle *pTVar1;
  Container *pCVar2;
  Container *pCVar3;
  uint uVar4;
  Container **ppCVar5;
  long lVar6;
  
  if (Tree->Children == (QuadTreeNode *)0x0) {
    pCVar3 = Tree->Contents;
    if (pCVar3 != (Container *)0x0) {
      Tree->Contents = (Container *)0x0;
      Tree->PostContents = (Container *)0x0;
      do {
        pTVar1 = (pCVar3->Content).T;
        if (pCVar3->Type == OBJECT) {
          uVar4 = *(uint *)(pTVar1->Edges + 1);
        }
        else {
          uVar4 = pTVar1->EdgeFlags[1] | pTVar1->EdgeFlags[0] | pTVar1->EdgeFlags[2];
        }
        ppCVar5 = &Tree->Contents;
        if ((uVar4 >> 9 & 1) != 0) {
          ppCVar5 = &Tree->PostContents;
        }
        pCVar2 = pCVar3->Next;
        pCVar3->Next = *ppCVar5;
        *ppCVar5 = pCVar3;
        pCVar3 = pCVar2;
      } while (pCVar2 != (Container *)0x0);
    }
  }
  else {
    lVar6 = 0xd8;
    do {
      SplitTree((QuadTreeNode *)((long)(Tree->Children->Bounder).TL.Pos + lVar6));
      lVar6 = lVar6 + -0x48;
    } while (lVar6 != -0x48);
  }
  return;
}

Assistant:

void SplitTree(struct QuadTreeNode *Tree)
{
   struct Container *P, *PNext;
   int c = 4;

   if (Tree->Children) {
      while (c--)
         SplitTree(&Tree->Children[c]);
   } else if (Tree->Contents) {
      P = Tree->Contents;
      Tree->Contents = Tree->PostContents = NULL;

      while (P) {
         PNext = P->Next;

         if (P->Type == OBJECT) {
            if (P->Content.O->Flags & FLAGS_FOREGROUND) {
               P->Next = Tree->PostContents;
               Tree->PostContents = P;
            } else {
               P->Next = Tree->Contents;
               Tree->Contents = P;
            }
         } else {
            if ((P->Content.T->EdgeFlags[0] | P->Content.T->
                 EdgeFlags[1] | P->Content.T->EdgeFlags[2])
                & FLAGS_FOREGROUND) {
               P->Next = Tree->PostContents;
               Tree->PostContents = P;
            } else {
               P->Next = Tree->Contents;
               Tree->Contents = P;
            }
         }

         P = PNext;
      }
   }
}